

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

void __thiscall
sc_core::wif_trace_file::trace(wif_trace_file *this,uint64 *object_,string *name_,int width_)

{
  bool bVar1;
  wif_uint64_trace *this_00;
  string sStack_58;
  wif_uint64_trace *local_38;
  
  bVar1 = sc_trace_file_base::add_trace_check(&this->super_sc_trace_file_base,name_);
  if (bVar1) {
    this_00 = (wif_uint64_trace *)operator_new(0x70);
    obtain_name_abi_cxx11_(&sStack_58,this);
    wif_uint64_trace::wif_uint64_trace(this_00,object_,name_,&sStack_58,width_);
    local_38 = this_00;
    std::vector<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>::push_back
              (&this->traces,(value_type *)&local_38);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void
wif_trace_file::trace( const unsigned& object_,
		       const std::string& name_,
		       const char** enum_literals_ )
{
    if( add_trace_check(name_) )
        traces.push_back( new wif_enum_trace( object_,
                                              name_,
                                              obtain_name(),
                                              enum_literals_ ) );
}